

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O3

void __thiscall cnn::AdadeltaTrainer::update(AdadeltaTrainer *this,real scale)

{
  real rVar1;
  scalar_constant_op<float> sVar2;
  pointer pSVar3;
  pointer pSVar4;
  float *pfVar5;
  pointer pSVar6;
  float *pfVar7;
  float *pfVar8;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  eVar9;
  bool bVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  byte bVar15;
  byte bVar16;
  pointer pSVar17;
  DstEvaluatorType *pDVar18;
  assign_op<float,_float> *paVar19;
  Parameters *this_00;
  uint uVar20;
  Model *pMVar21;
  long *plVar22;
  long lVar23;
  char *__function;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  Index dstRows;
  AdadeltaTrainer *pAVar27;
  ulong uVar28;
  Index index_3;
  ulong uVar29;
  long lVar30;
  long lVar31;
  Index index;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  eVar32;
  Parameters *pPVar33;
  Index index_1;
  ulong uVar34;
  ulong uVar35;
  Index dstRows_3;
  long *plVar36;
  float *pfVar37;
  Index dstRows_2;
  uint uVar38;
  Index dstRows_1;
  ushort uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  int iVar77;
  int iVar78;
  real rVar79;
  undefined1 auVar80 [64];
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  assign_op<float,_float> local_2e9;
  AdadeltaTrainer *local_2e8;
  real local_2e0;
  real local_2dc;
  generic_dense_assignment_kernel<_ad2e0912_> local_2d8;
  ulong local_2b8;
  ulong local_2b0;
  pointer local_2a8;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  local_2a0;
  undefined1 local_298 [16];
  long *local_280;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  local_278;
  long *local_270;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  local_268;
  Parameters *local_260;
  float *local_258;
  float *local_250;
  DstEvaluatorType local_240;
  undefined1 local_228 [16];
  long *local_210;
  undefined1 local_208 [52];
  float fStack_1d4;
  ulong local_1c8;
  float *local_1b0;
  scalar_constant_op<float> local_1a4;
  ulong local_1a0;
  float *local_198;
  variable_if_dynamic<long,__1> local_188;
  float *local_180;
  float *local_170;
  real local_168;
  variable_if_dynamic<long,__1> local_160;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  local_158;
  Parameters *local_148;
  float *local_140;
  variable_if_dynamic<long,__1> local_130;
  scalar_constant_op<float> local_128;
  scalar_constant_op<float> local_104;
  float *local_f8;
  variable_if_dynamic<long,__1> local_e8;
  float *local_d0;
  variable_if_dynamic<long,__1> local_c0;
  scalar_constant_op<float> local_b8;
  float *local_a0;
  variable_if_dynamic<long,__1> local_90;
  scalar_constant_op<float> local_88;
  undefined1 local_78 [64];
  
  local_2b8 = CONCAT44(local_2b8._4_4_,scale);
  if (this->shadow_params_allocated == false) {
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_2d8,
               (this->super_Trainer).model);
    pSVar3 = (this->hg).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->hg).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_2d8.m_functor._4_4_,local_2d8.m_functor._0_4_);
    local_208._0_8_ =
         (this->hg).
         super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>._M_impl.
         super__Vector_impl_data._M_start;
    pSVar6 = (this->hg).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    (this->hg).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_2d8.m_dst._4_4_,local_2d8.m_dst._0_4_);
    (this->hg).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_2d8.m_src._4_4_,local_2d8.m_src._0_4_);
    local_2d8.m_dst._0_4_ = 0.0;
    local_2d8.m_functor._0_4_ = 0;
    local_2d8.m_functor._4_4_ = 0;
    local_2d8.m_dst._4_4_ = 0;
    local_2d8.m_src._0_4_ = 0;
    local_2d8.m_src._4_4_ = 0;
    local_208._8_4_ = SUB84(pSVar6,0);
    local_208._12_4_ = (undefined4)((ulong)pSVar6 >> 0x20);
    local_208._16_4_ = SUB84(pSVar3,0);
    local_208._20_4_ = (undefined4)((ulong)pSVar3 >> 0x20);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)local_208);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_2d8);
    AllocateShadowLookupParameters
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_2d8,(this->super_Trainer).model);
    pSVar4 = (this->hlg).
             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->hlg).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_2d8.m_functor._4_4_,local_2d8.m_functor._0_4_);
    local_208._0_8_ =
         (this->hlg).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pSVar17 = (this->hlg).
              super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (this->hlg).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_2d8.m_dst._4_4_,local_2d8.m_dst._0_4_);
    (this->hlg).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_2d8.m_src._4_4_,local_2d8.m_src._0_4_);
    local_2d8.m_dst._0_4_ = 0.0;
    local_2d8.m_functor._0_4_ = 0;
    local_2d8.m_functor._4_4_ = 0;
    local_2d8.m_dst._4_4_ = 0;
    local_2d8.m_src._0_4_ = 0;
    local_2d8.m_src._4_4_ = 0;
    local_208._8_4_ = SUB84(pSVar17,0);
    local_208._12_4_ = (undefined4)((ulong)pSVar17 >> 0x20);
    local_208._16_4_ = SUB84(pSVar4,0);
    local_208._20_4_ = (undefined4)((ulong)pSVar4 >> 0x20);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               local_208);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_2d8);
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_2d8,
               (this->super_Trainer).model);
    pSVar3 = (this->hd).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->hd).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_2d8.m_functor._4_4_,local_2d8.m_functor._0_4_);
    local_208._0_8_ =
         (this->hd).
         super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>._M_impl.
         super__Vector_impl_data._M_start;
    pSVar6 = (this->hd).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    (this->hd).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_2d8.m_dst._4_4_,local_2d8.m_dst._0_4_);
    (this->hd).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_2d8.m_src._4_4_,local_2d8.m_src._0_4_);
    local_2d8.m_dst._0_4_ = 0.0;
    local_2d8.m_functor._0_4_ = 0;
    local_2d8.m_functor._4_4_ = 0;
    local_2d8.m_dst._4_4_ = 0;
    local_2d8.m_src._0_4_ = 0;
    local_2d8.m_src._4_4_ = 0;
    local_208._8_4_ = SUB84(pSVar6,0);
    local_208._12_4_ = (undefined4)((ulong)pSVar6 >> 0x20);
    local_208._16_4_ = SUB84(pSVar3,0);
    local_208._20_4_ = (undefined4)((ulong)pSVar3 >> 0x20);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)local_208);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_2d8);
    AllocateShadowLookupParameters
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_2d8,(this->super_Trainer).model);
    pSVar4 = (this->hld).
             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->hld).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_2d8.m_functor._4_4_,local_2d8.m_functor._0_4_);
    local_208._0_8_ =
         (this->hld).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pSVar17 = (this->hld).
              super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (this->hld).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_2d8.m_dst._4_4_,local_2d8.m_dst._0_4_);
    (this->hld).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_2d8.m_src._4_4_,local_2d8.m_src._0_4_);
    local_2d8.m_dst._0_4_ = 0.0;
    local_2d8.m_functor._0_4_ = 0;
    local_2d8.m_functor._4_4_ = 0;
    local_2d8.m_dst._4_4_ = 0;
    local_2d8.m_src._0_4_ = 0;
    local_2d8.m_src._4_4_ = 0;
    local_208._8_4_ = SUB84(pSVar17,0);
    local_208._12_4_ = (undefined4)((ulong)pSVar17 >> 0x20);
    local_208._16_4_ = SUB84(pSVar4,0);
    local_208._20_4_ = (undefined4)((ulong)pSVar4 >> 0x20);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               local_208);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_2d8);
    this->shadow_params_allocated = true;
  }
  local_280._0_4_ = Trainer::clip_gradients(&this->super_Trainer);
  pMVar21 = (this->super_Trainer).model;
  local_278 = *(evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                *)(pMVar21 + 0x20);
  eVar32 = *(evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
             *)(pMVar21 + 0x18);
  local_2e8 = this;
  if (eVar32 != local_278) {
    fVar11 = local_280._0_4_ * (float)local_2b8;
    auVar80 = ZEXT464((uint)fVar11);
    auVar42 = vbroadcasti64x4_avx512f(_DAT_002e5dc0);
    auVar43 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar44 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar45 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    plVar22 = (long *)0x0;
    local_78 = vmovdqu64_avx512f(auVar42);
    local_298 = ZEXT416((uint)fVar11);
    local_2a8 = (pointer)CONCAT44(local_2a8._4_4_,fVar11 * fVar11);
    pDVar18 = local_2d8.m_dst;
    paVar19 = local_2d8.m_functor;
    do {
      auVar12 = local_228;
      local_2d8.m_functor._4_4_ = (undefined4)((ulong)paVar19 >> 0x20);
      local_2d8.m_dst._4_4_ = (undefined4)((ulong)pDVar18 >> 0x20);
      pPVar33 = *(Parameters **)eVar32;
      iVar78 = 1;
      iVar77 = 1;
      uVar28 = (ulong)(pPVar33->g).d.nd;
      if (uVar28 != 0) {
        auVar42 = vmovdqa64_avx512f(auVar43);
        auVar46 = vpbroadcastq_avx512f();
        uVar24 = 0;
        do {
          auVar47 = vpbroadcastq_avx512f();
          auVar48 = vmovdqa64_avx512f(auVar42);
          auVar42 = vporq_avx512f(auVar47,auVar44);
          auVar47 = vporq_avx512f(auVar47,auVar45);
          uVar14 = vpcmpuq_avx512f(auVar47,auVar46,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar42,auVar46,2);
          bVar16 = (byte)uVar14;
          uVar39 = CONCAT11(bVar16,bVar15);
          auVar47 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pPVar33->g).d.d + uVar24));
          auVar42._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar47._4_4_;
          auVar42._0_4_ = (uint)(bVar15 & 1) * auVar47._0_4_;
          auVar42._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar47._8_4_;
          auVar42._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar47._12_4_;
          auVar42._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar47._16_4_;
          auVar42._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar47._20_4_;
          auVar42._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar47._24_4_;
          auVar42._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar47._28_4_;
          auVar42._32_4_ = (uint)(bVar16 & 1) * auVar47._32_4_;
          auVar42._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar47._36_4_;
          auVar42._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar47._40_4_;
          auVar42._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar47._44_4_;
          auVar42._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar47._48_4_;
          auVar42._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar47._52_4_;
          auVar42._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar47._56_4_;
          auVar42._60_4_ = (uint)(bVar16 >> 7) * auVar47._60_4_;
          uVar24 = uVar24 + 0x10;
          auVar42 = vpmulld_avx512f(auVar42,auVar48);
        } while ((uVar28 + 0xf & 0x1fffffff0) != uVar24);
        auVar42 = vmovdqa32_avx512f(auVar42);
        auVar46._0_4_ =
             (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar48._0_4_;
        bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar46._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar48._4_4_;
        bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar46._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar48._8_4_;
        bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
        auVar46._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar48._12_4_;
        bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
        auVar46._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar48._16_4_;
        bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
        auVar46._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar48._20_4_;
        bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
        auVar46._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar48._24_4_;
        bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
        auVar46._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar48._28_4_;
        auVar46._32_4_ =
             (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar48._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar46._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar48._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar46._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar48._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar46._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar48._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar46._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar48._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar46._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar48._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar46._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar48._56_4_;
        auVar46._60_4_ =
             (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar48._60_4_;
        auVar41 = vextracti64x4_avx512f(auVar46,1);
        auVar42 = vpmulld_avx512f(auVar46,ZEXT3264(auVar41));
        auVar40 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar13 = vpshufd_avx(auVar40,0xee);
        auVar40 = vpmulld_avx(auVar40,auVar13);
        auVar13 = vpshufd_avx(auVar40,0x55);
        auVar40 = vpmulld_avx(auVar40,auVar13);
        iVar77 = auVar40._0_4_;
      }
      uVar28 = (ulong)(pPVar33->values).d.nd;
      if (uVar28 != 0) {
        auVar42 = vmovdqa64_avx512f(auVar43);
        auVar46 = vpbroadcastq_avx512f();
        uVar24 = 0;
        do {
          auVar47 = vpbroadcastq_avx512f();
          auVar48 = vmovdqa64_avx512f(auVar42);
          auVar42 = vporq_avx512f(auVar47,auVar44);
          auVar47 = vporq_avx512f(auVar47,auVar45);
          uVar14 = vpcmpuq_avx512f(auVar47,auVar46,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar42,auVar46,2);
          bVar16 = (byte)uVar14;
          uVar39 = CONCAT11(bVar16,bVar15);
          auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)&(((_Vector_impl *)(pPVar33->values).d.d)->
                                               super__Vector_impl_data)._M_start + uVar24 * 4));
          auVar47._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
          auVar47._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
          auVar47._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
          auVar47._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
          auVar47._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
          auVar47._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
          auVar47._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
          auVar47._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
          auVar47._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
          auVar47._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
          auVar47._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
          auVar47._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
          auVar47._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
          auVar47._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
          auVar47._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
          auVar47._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
          uVar24 = uVar24 + 0x10;
          auVar42 = vpmulld_avx512f(auVar47,auVar48);
        } while ((uVar28 + 0xf & 0x1fffffff0) != uVar24);
        auVar42 = vmovdqa32_avx512f(auVar42);
        auVar49._0_4_ =
             (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar48._0_4_;
        bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar49._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar48._4_4_;
        bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar49._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar48._8_4_;
        bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
        auVar49._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar48._12_4_;
        bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
        auVar49._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar48._16_4_;
        bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
        auVar49._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar48._20_4_;
        bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
        auVar49._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar48._24_4_;
        bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
        auVar49._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar48._28_4_;
        auVar49._32_4_ =
             (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar48._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar49._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar48._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar49._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar48._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar49._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar48._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar49._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar48._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar49._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar48._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar49._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar48._56_4_;
        auVar49._60_4_ =
             (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar48._60_4_;
        auVar41 = vextracti64x4_avx512f(auVar49,1);
        auVar42 = vpmulld_avx512f(auVar49,ZEXT3264(auVar41));
        auVar40 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar13 = vpshufd_avx(auVar40,0xee);
        auVar40 = vpmulld_avx(auVar40,auVar13);
        auVar13 = vpshufd_avx(auVar40,0x55);
        auVar40 = vpmulld_avx(auVar40,auVar13);
        iVar78 = auVar40._0_4_;
      }
      local_228._4_4_ = 0;
      local_228._0_4_ = iVar78 * (pPVar33->values).d.bd;
      uVar26 = iVar77 * (pPVar33->g).d.bd;
      uVar28 = (ulong)uVar26;
      local_2a0 = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                   )(pPVar33->values).v;
      pfVar5 = (pPVar33->g).v;
      pSVar3 = (local_2e8->hg).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      rVar1 = (local_2e8->super_Trainer).lambda;
      pSVar6 = (local_2e8->hd).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_228._8_8_ = auVar12._8_8_;
      pfVar7 = pSVar3[(long)plVar22].h.v;
      uVar24 = (ulong)pSVar3[(long)plVar22].h.d.nd;
      local_270 = plVar22;
      local_268 = eVar32;
      local_260 = pPVar33;
      if (uVar24 == 0) {
        uVar20 = pSVar3[(long)plVar22].h.d.bd;
        if (uVar20 != uVar26) goto LAB_0027a847;
        rVar79 = local_2e8->rho;
LAB_002793ec:
        iVar77 = 1;
      }
      else {
        auVar42 = vmovdqa64_avx512f(auVar43);
        uVar34 = uVar24 + 0xf & 0x1fffffff0;
        auVar46 = vpbroadcastq_avx512f();
        uVar29 = 0;
        do {
          auVar47 = vpbroadcastq_avx512f();
          auVar48 = vmovdqa64_avx512f(auVar42);
          auVar42 = vporq_avx512f(auVar47,auVar44);
          auVar47 = vporq_avx512f(auVar47,auVar45);
          uVar14 = vpcmpuq_avx512f(auVar47,auVar46,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar42,auVar46,2);
          bVar16 = (byte)uVar14;
          uVar39 = CONCAT11(bVar16,bVar15);
          auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar3[(long)plVar22].h.d.d + uVar29 * 4));
          auVar50._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
          auVar50._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
          auVar50._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
          auVar50._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
          auVar50._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
          auVar50._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
          auVar50._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
          auVar50._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
          auVar50._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
          auVar50._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
          auVar50._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
          auVar50._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
          auVar50._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
          auVar50._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
          auVar50._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
          auVar50._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
          uVar29 = uVar29 + 0x10;
          auVar42 = vpmulld_avx512f(auVar50,auVar48);
        } while (uVar34 != uVar29);
        auVar42 = vmovdqa32_avx512f(auVar42);
        auVar51._0_4_ =
             (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar48._0_4_;
        bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar51._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar48._4_4_;
        bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar51._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar48._8_4_;
        bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
        auVar51._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar48._12_4_;
        bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
        auVar51._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar48._16_4_;
        bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
        auVar51._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar48._20_4_;
        bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
        auVar51._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar48._24_4_;
        bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
        auVar51._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar48._28_4_;
        auVar51._32_4_ =
             (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar48._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar51._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar48._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar51._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar48._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar51._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar48._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar51._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar48._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar51._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar48._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar51._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar48._56_4_;
        auVar51._60_4_ =
             (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar48._60_4_;
        auVar41 = vextracti64x4_avx512f(auVar51,1);
        uVar20 = pSVar3[(long)plVar22].h.d.bd;
        auVar42 = vpmulld_avx512f(auVar51,ZEXT3264(auVar41));
        auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar40 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpmulld_avx(auVar12,auVar40);
        auVar40 = vpshufd_avx(auVar12,0x55);
        auVar12 = vpmulld_avx(auVar12,auVar40);
        if (auVar12._0_4_ * uVar20 != uVar26) goto LAB_0027a847;
        rVar79 = local_2e8->rho;
        if (uVar24 == 0) goto LAB_002793ec;
        uVar24 = 0;
        auVar42 = vmovdqa64_avx512f(auVar43);
        do {
          auVar47 = vpbroadcastq_avx512f();
          auVar48 = vmovdqa64_avx512f(auVar42);
          auVar42 = vporq_avx512f(auVar47,auVar44);
          auVar47 = vporq_avx512f(auVar47,auVar45);
          uVar14 = vpcmpuq_avx512f(auVar47,auVar46,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar42,auVar46,2);
          bVar16 = (byte)uVar14;
          uVar39 = CONCAT11(bVar16,bVar15);
          auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar3[(long)plVar22].h.d.d + uVar24 * 4));
          auVar52._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
          auVar52._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
          auVar52._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
          auVar52._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
          auVar52._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
          auVar52._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
          auVar52._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
          auVar52._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
          auVar52._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
          auVar52._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
          auVar52._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
          auVar52._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
          auVar52._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
          auVar52._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
          auVar52._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
          auVar52._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
          uVar24 = uVar24 + 0x10;
          auVar42 = vpmulld_avx512f(auVar52,auVar48);
        } while (uVar34 != uVar24);
        auVar42 = vmovdqa32_avx512f(auVar42);
        auVar53._0_4_ =
             (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar48._0_4_;
        bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar53._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar48._4_4_;
        bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar53._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar48._8_4_;
        bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
        auVar53._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar48._12_4_;
        bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
        auVar53._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar48._16_4_;
        bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
        auVar53._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar48._20_4_;
        bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
        auVar53._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar48._24_4_;
        bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
        auVar53._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar48._28_4_;
        auVar53._32_4_ =
             (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar48._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar53._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar48._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar53._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar48._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar53._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar48._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar53._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar48._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar53._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar48._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar53._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar48._56_4_;
        auVar53._60_4_ =
             (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar48._60_4_;
        auVar41 = vextracti64x4_avx512f(auVar53,1);
        auVar42 = vpmulld_avx512f(auVar53,ZEXT3264(auVar41));
        auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar40 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpmulld_avx(auVar12,auVar40);
        auVar40 = vpshufd_avx(auVar12,0x55);
        auVar12 = vpmulld_avx(auVar12,auVar40);
        iVar77 = auVar12._0_4_;
      }
      local_208._0_4_ = rVar79;
      local_2d8.m_dst._0_4_ = auVar80._0_4_;
      local_208._12_4_ = SUB84(pfVar7,0);
      local_208._16_4_ = (undefined4)((ulong)pfVar7 >> 0x20);
      local_2d8.m_src._4_4_ = SUB84(pfVar5,0);
      local_2d8.m_functor._0_4_ = (undefined4)((ulong)pfVar5 >> 0x20);
      if (uVar20 * iVar77 != uVar26) {
LAB_0027a7d5:
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                     );
      }
      uVar24 = uVar28;
      if ((((ulong)pfVar7 & 3) == 0) &&
         (uVar24 = (ulong)(-((uint)((ulong)pfVar7 >> 2) & 0x3fffffff) & 0xf), uVar28 <= uVar24)) {
        uVar24 = uVar28;
      }
      auVar42 = vmovdqu64_avx512f(local_78);
      fVar11 = 1.0 - rVar79;
      uVar34 = uVar28 - uVar24;
      uVar29 = uVar34 + 0xf;
      if (-1 < (long)uVar34) {
        uVar29 = uVar34;
      }
      auVar42 = vpermt2d_avx512f(ZEXT3264(CONCAT1616(CONCAT412(local_2d8.m_dst._0_4_,
                                                               CONCAT48(local_2d8.m_dst._0_4_,
                                                                        CONCAT44(local_2d8.m_dst.
                                                                                 _0_4_,local_2d8.
                                                                                       m_dst._0_4_))
                                                              ),ZEXT416((uint)fVar11))),auVar42,
                                 ZEXT864(pfVar5));
      auVar80 = valignd_avx512f(auVar42,auVar42,9);
      if (uVar24 != 0) {
        lVar23 = 0;
        do {
          auVar12 = vfmadd132ss_fma(ZEXT416((uint)(fVar11 * local_2a8._0_4_ *
                                                  *(float *)(auVar80._0_8_ + lVar23 * 4))),
                                    ZEXT416((uint)(rVar79 * pfVar7[lVar23])),
                                    ZEXT416((uint)pfVar5[lVar23]));
          pfVar7[lVar23] = auVar12._0_4_;
          lVar23 = lVar23 + 1;
        } while (uVar24 != lVar23);
      }
      lVar23 = uVar24 + (uVar29 & 0xfffffffffffffff0);
      if (0xf < (long)uVar34) {
        auVar46 = vpmovsxbd_avx512f(_DAT_002e5da0);
        auVar42 = vpermt2d_avx512f(auVar42,auVar46,ZEXT464(uVar26));
        auVar46 = vbroadcastss_avx512f(ZEXT416((uint)rVar79));
        auVar40 = vextracti32x4_avx512f(auVar42,2);
        lVar25 = vpextrq_avx(auVar40,1);
        auVar12 = vpshufd_avx(auVar42._16_16_,0xee);
        auVar42 = vbroadcastss_avx512f
                            (ZEXT416((uint)(auVar12._0_4_ * auVar42._0_4_ * local_2d8.m_dst._0_4_)))
        ;
        do {
          auVar47 = vmulps_avx512f(auVar46,*(undefined1 (*) [64])(pfVar7 + uVar24));
          auVar48 = vmulps_avx512f(auVar42,*(undefined1 (*) [64])
                                            ((lVar25 << 0x20 | auVar40._0_8_ >> 0x20) + uVar24 * 4))
          ;
          auVar47 = vfmadd132ps_avx512f(auVar48,auVar47,*(undefined1 (*) [64])(pfVar5 + uVar24));
          *(undefined1 (*) [64])(pfVar7 + uVar24) = auVar47;
          uVar24 = uVar24 + 0x10;
        } while ((long)uVar24 < lVar23);
      }
      if (lVar23 < (long)uVar28) {
        do {
          auVar12 = vfmadd132ss_fma(ZEXT416((uint)(fVar11 * local_2a8._0_4_ *
                                                  *(float *)(auVar80._0_8_ + lVar23 * 4))),
                                    ZEXT416((uint)(rVar79 * pfVar7[lVar23])),
                                    ZEXT416((uint)pfVar5[lVar23]));
          pfVar7[lVar23] = auVar12._0_4_;
          lVar23 = lVar23 + 1;
        } while (uVar28 != lVar23);
      }
      pfVar7 = pSVar6[(long)plVar22].h.v;
      uVar24 = (ulong)pSVar6[(long)plVar22].h.d.nd;
      if (uVar24 == 0) {
        iVar77 = 1;
      }
      else {
        uVar29 = 0;
        auVar42 = vmovdqa64_avx512f(auVar43);
        auVar80 = vpbroadcastq_avx512f();
        do {
          auVar46 = vpbroadcastq_avx512f();
          auVar47 = vmovdqa64_avx512f(auVar42);
          auVar42 = vporq_avx512f(auVar46,auVar44);
          auVar46 = vporq_avx512f(auVar46,auVar45);
          uVar14 = vpcmpuq_avx512f(auVar46,auVar80,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar42,auVar80,2);
          bVar16 = (byte)uVar14;
          uVar39 = CONCAT11(bVar16,bVar15);
          auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar6[(long)plVar22].h.d.d + uVar29 * 4));
          auVar48._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
          auVar48._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
          auVar48._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
          auVar48._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
          auVar48._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
          auVar48._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
          auVar48._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
          auVar48._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
          auVar48._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
          auVar48._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
          auVar48._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
          auVar48._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
          auVar48._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
          auVar48._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
          auVar48._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
          auVar48._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
          uVar29 = uVar29 + 0x10;
          auVar42 = vpmulld_avx512f(auVar48,auVar47);
        } while ((uVar24 + 0xf & 0x1fffffff0) != uVar29);
        auVar42 = vmovdqa32_avx512f(auVar42);
        auVar80._0_4_ =
             (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar47._0_4_;
        bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar80._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar47._4_4_;
        bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar80._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar47._8_4_;
        bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
        auVar80._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar47._12_4_;
        bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
        auVar80._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar47._16_4_;
        bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
        auVar80._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar47._20_4_;
        bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
        auVar80._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar47._24_4_;
        bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
        auVar80._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar47._28_4_;
        auVar80._32_4_ =
             (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar47._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar80._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar47._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar80._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar47._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar80._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar47._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar80._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar47._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar80._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar47._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar80._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar47._56_4_;
        auVar80._60_4_ =
             (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar47._60_4_;
        auVar41 = vextracti64x4_avx512f(auVar80,1);
        auVar42 = vpmulld_avx512f(auVar80,ZEXT3264(auVar41));
        auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar40 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpmulld_avx(auVar12,auVar40);
        auVar40 = vpshufd_avx(auVar12,0x55);
        auVar12 = vpmulld_avx(auVar12,auVar40);
        iVar77 = auVar12._0_4_;
      }
      uVar20 = pSVar6[(long)plVar22].h.d.bd;
      uVar29 = (ulong)(iVar77 * uVar20);
      if (uVar26 - iVar77 * uVar20 != 0) goto LAB_0027a819;
      uVar34 = (ulong)pSVar3[(long)plVar22].h.d.nd;
      if (uVar34 == 0) {
        iVar77 = 1;
      }
      else {
        auVar42 = vmovdqa64_avx512f(auVar43);
        auVar80 = vpbroadcastq_avx512f();
        uVar35 = 0;
        do {
          auVar46 = vpbroadcastq_avx512f();
          auVar47 = vmovdqa64_avx512f(auVar42);
          auVar42 = vporq_avx512f(auVar46,auVar44);
          auVar46 = vporq_avx512f(auVar46,auVar45);
          uVar14 = vpcmpuq_avx512f(auVar46,auVar80,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar42,auVar80,2);
          bVar16 = (byte)uVar14;
          uVar39 = CONCAT11(bVar16,bVar15);
          auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar3[(long)plVar22].h.d.d + uVar35 * 4));
          auVar54._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
          auVar54._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
          auVar54._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
          auVar54._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
          auVar54._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
          auVar54._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
          auVar54._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
          auVar54._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
          auVar54._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
          auVar54._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
          auVar54._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
          auVar54._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
          auVar54._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
          auVar54._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
          auVar54._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
          auVar54._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
          uVar35 = uVar35 + 0x10;
          auVar42 = vpmulld_avx512f(auVar54,auVar47);
        } while ((uVar34 + 0xf & 0x1fffffff0) != uVar35);
        auVar42 = vmovdqa32_avx512f(auVar42);
        auVar55._0_4_ =
             (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar47._0_4_;
        bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar47._4_4_;
        bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar47._8_4_;
        bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
        auVar55._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar47._12_4_;
        bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
        auVar55._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar47._16_4_;
        bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
        auVar55._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar47._20_4_;
        bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
        auVar55._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar47._24_4_;
        bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
        auVar55._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar47._28_4_;
        auVar55._32_4_ =
             (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar47._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar55._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar47._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar55._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar47._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar55._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar47._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar55._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar47._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar55._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar47._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar55._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar47._56_4_;
        auVar55._60_4_ =
             (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar47._60_4_;
        auVar41 = vextracti64x4_avx512f(auVar55,1);
        auVar42 = vpmulld_avx512f(auVar55,ZEXT3264(auVar41));
        auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar40 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpmulld_avx(auVar12,auVar40);
        auVar40 = vpshufd_avx(auVar12,0x55);
        auVar12 = vpmulld_avx(auVar12,auVar40);
        iVar77 = auVar12._0_4_;
      }
      uVar38 = iVar77 * pSVar3[(long)plVar22].h.d.bd;
      pfVar37 = (float *)(ulong)uVar38;
      if (uVar26 - uVar38 != 0) goto LAB_0027a875;
      pfVar8 = pSVar3[(long)plVar22].h.v;
      sVar2.m_other = local_2e8->epsilon;
      if (uVar24 == 0) {
        if (uVar20 != uVar26) goto LAB_0027a830;
        local_208._12_4_ = local_2e8->rho;
        uVar38 = uVar20;
LAB_00279845:
        iVar77 = 1;
      }
      else {
        uVar34 = 0;
        auVar42 = vmovdqa64_avx512f(auVar43);
        uVar35 = uVar24 + 0xf & 0x1fffffff0;
        auVar80 = vpbroadcastq_avx512f();
        do {
          auVar46 = vpbroadcastq_avx512f();
          auVar47 = vmovdqa64_avx512f(auVar42);
          auVar42 = vporq_avx512f(auVar46,auVar44);
          auVar46 = vporq_avx512f(auVar46,auVar45);
          uVar14 = vpcmpuq_avx512f(auVar46,auVar80,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar42,auVar80,2);
          bVar16 = (byte)uVar14;
          uVar39 = CONCAT11(bVar16,bVar15);
          auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar6[(long)plVar22].h.d.d + uVar34 * 4));
          auVar56._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
          auVar56._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
          auVar56._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
          auVar56._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
          auVar56._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
          auVar56._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
          auVar56._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
          auVar56._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
          auVar56._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
          auVar56._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
          auVar56._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
          auVar56._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
          auVar56._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
          auVar56._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
          auVar56._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
          auVar56._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
          uVar34 = uVar34 + 0x10;
          auVar42 = vpmulld_avx512f(auVar56,auVar47);
        } while (uVar35 != uVar34);
        auVar42 = vmovdqa32_avx512f(auVar42);
        auVar57._0_4_ =
             (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar47._0_4_;
        bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar57._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar47._4_4_;
        bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar57._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar47._8_4_;
        bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
        auVar57._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar47._12_4_;
        bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
        auVar57._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar47._16_4_;
        bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
        auVar57._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar47._20_4_;
        bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
        auVar57._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar47._24_4_;
        bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
        auVar57._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar47._28_4_;
        auVar57._32_4_ =
             (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar47._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar57._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar47._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar57._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar47._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar57._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar47._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar57._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar47._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar57._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar47._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar57._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar47._56_4_;
        auVar57._60_4_ =
             (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar47._60_4_;
        auVar41 = vextracti64x4_avx512f(auVar57,1);
        auVar42 = vpmulld_avx512f(auVar57,ZEXT3264(auVar41));
        auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar40 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpmulld_avx(auVar12,auVar40);
        auVar40 = vpshufd_avx(auVar12,0x55);
        auVar12 = vpmulld_avx(auVar12,auVar40);
        uVar38 = auVar12._0_4_ * uVar20;
        if (uVar38 != uVar26) goto LAB_0027a830;
        local_208._12_4_ = local_2e8->rho;
        if (uVar24 == 0) goto LAB_00279845;
        uVar24 = 0;
        auVar42 = vmovdqa64_avx512f(auVar43);
        do {
          auVar43 = vpbroadcastq_avx512f();
          auVar46 = vmovdqa64_avx512f(auVar42);
          auVar42 = vporq_avx512f(auVar43,auVar44);
          auVar43 = vporq_avx512f(auVar43,auVar45);
          uVar14 = vpcmpuq_avx512f(auVar43,auVar80,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar42,auVar80,2);
          bVar16 = (byte)uVar14;
          uVar39 = CONCAT11(bVar16,bVar15);
          auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar6[(long)plVar22].h.d.d + uVar24 * 4));
          auVar43._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
          auVar43._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
          auVar43._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
          auVar43._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
          auVar43._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
          auVar43._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
          auVar43._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
          auVar43._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
          auVar43._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
          auVar43._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
          auVar43._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
          auVar43._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
          auVar43._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
          auVar43._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
          auVar43._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
          auVar43._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
          uVar24 = uVar24 + 0x10;
          auVar42 = vpmulld_avx512f(auVar43,auVar46);
        } while (uVar35 != uVar24);
        auVar42 = vmovdqa32_avx512f(auVar42);
        auVar44._0_4_ =
             (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar46._0_4_;
        bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar44._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar46._4_4_;
        bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar44._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar46._8_4_;
        bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
        auVar44._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar46._12_4_;
        bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
        auVar44._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar46._16_4_;
        bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
        auVar44._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar46._20_4_;
        bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
        auVar44._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar46._24_4_;
        bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
        auVar44._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar46._28_4_;
        auVar44._32_4_ =
             (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar46._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar44._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar46._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar44._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar46._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar44._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar46._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar44._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar46._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar44._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar46._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar44._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar46._56_4_;
        auVar44._60_4_ =
             (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar46._60_4_;
        auVar41 = vextracti64x4_avx512f(auVar44,1);
        auVar42 = vpmulld_avx512f(auVar44,ZEXT3264(auVar41));
        auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar40 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpmulld_avx(auVar12,auVar40);
        auVar40 = vpshufd_avx(auVar12,0x55);
        auVar12 = vpmulld_avx(auVar12,auVar40);
        iVar77 = auVar12._0_4_;
      }
      local_250 = (float *)(ulong)(uVar20 * iVar77);
      local_208._40_8_ = ZEXT48(uVar38);
      stack0xfffffffffffffe28 = (float *)CONCAT44(1.0 - (float)local_208._12_4_,local_208._48_4_);
      local_158.m_functor.m_other = sVar2.m_other;
      local_2e0 = sVar2.m_other;
      local_2dc = rVar1;
      local_2b0 = uVar29;
      local_258 = pfVar7;
      local_208._24_8_ = pfVar7;
      local_1a4.m_other = local_2d8.m_dst._0_4_;
      local_198 = pfVar5;
      local_188.m_value = uVar28;
      local_170 = pfVar7;
      local_160.m_value = uVar29;
      local_140 = pfVar8;
      local_130.m_value = (long)pfVar37;
      local_128.m_other = sVar2.m_other;
      local_104.m_other = local_2d8.m_dst._0_4_;
      local_f8 = pfVar5;
      local_e8.m_value = uVar28;
      local_d0 = pfVar7;
      local_c0.m_value = uVar29;
      local_b8.m_other = sVar2.m_other;
      local_a0 = pfVar8;
      local_90.m_value = (long)pfVar37;
      local_88.m_other = sVar2.m_other;
      if (uVar20 * iVar77 != uVar26) goto LAB_0027a7d5;
      local_2d8.m_src = (SrcEvaluatorType *)local_208;
      local_2d8.m_functor = &local_2e9;
      local_2d8.m_dstExpr = (DstXprType *)&local_258;
      local_240.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
      .m_data = pfVar7;
      local_240.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value = (long)pfVar37;
      local_2d8.m_dst = &local_240;
      Eigen::internal::dense_assignment_loop<$6ae401cf$>::run(&local_2d8);
      this_00 = local_260;
      if (uVar26 != local_228._0_4_) goto LAB_0027a85e;
      auVar42 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar43 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar24 = (ulong)(local_260->values).d.nd;
      if (uVar24 == 0) {
        iVar77 = 1;
      }
      else {
        auVar45 = vpbroadcastq_avx512f();
        uVar29 = 0;
        do {
          auVar80 = vpbroadcastq_avx512f();
          auVar46 = vmovdqa64_avx512f(auVar42);
          auVar42 = vporq_avx512f(auVar80,auVar43);
          auVar80 = vporq_avx512f(auVar80,auVar44);
          uVar14 = vpcmpuq_avx512f(auVar80,auVar45,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar42,auVar45,2);
          bVar16 = (byte)uVar14;
          uVar39 = CONCAT11(bVar16,bVar15);
          auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)&(((_Vector_impl *)(pPVar33->values).d.d)->
                                               super__Vector_impl_data)._M_start + uVar29 * 4));
          auVar58._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
          auVar58._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
          auVar58._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
          auVar58._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
          auVar58._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
          auVar58._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
          auVar58._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
          auVar58._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
          auVar58._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
          auVar58._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
          auVar58._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
          auVar58._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
          auVar58._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
          auVar58._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
          auVar58._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
          auVar58._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
          uVar29 = uVar29 + 0x10;
          auVar42 = vpmulld_avx512f(auVar58,auVar46);
        } while ((uVar24 + 0xf & 0x1fffffff0) != uVar29);
        auVar42 = vmovdqa32_avx512f(auVar42);
        auVar45._0_4_ =
             (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar46._0_4_;
        bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar45._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar46._4_4_;
        bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar45._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar46._8_4_;
        bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
        auVar45._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar46._12_4_;
        bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
        auVar45._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar46._16_4_;
        bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
        auVar45._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar46._20_4_;
        bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
        auVar45._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar46._24_4_;
        bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
        auVar45._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar46._28_4_;
        auVar45._32_4_ =
             (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar46._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar45._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar46._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar45._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar46._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar45._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar46._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar45._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar46._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar45._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar46._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar45._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar46._56_4_;
        auVar45._60_4_ =
             (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar46._60_4_;
        auVar41 = vextracti64x4_avx512f(auVar45,1);
        auVar42 = vpmulld_avx512f(auVar45,ZEXT3264(auVar41));
        auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar40 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpmulld_avx(auVar12,auVar40);
        auVar40 = vpshufd_avx(auVar12,0x55);
        auVar12 = vpmulld_avx(auVar12,auVar40);
        iVar77 = auVar12._0_4_;
      }
      uVar20 = iVar77 * (local_260->values).d.bd;
      local_250 = (float *)(ulong)uVar20;
      local_258 = (local_260->values).v;
      local_208._36_4_ = local_298._0_4_;
      local_1a0 = local_2b0;
      local_198 = (float *)CONCAT44(local_198._4_4_,local_2e0);
      local_168 = local_2e0;
      local_158 = local_2a0;
      local_148 = (Parameters *)local_228._0_8_;
      local_140 = (float *)CONCAT44(local_140._4_4_,local_2dc);
      unique0x10002a0b = pfVar5;
      local_1c8 = uVar28;
      local_1b0 = pfVar7;
      local_180 = pfVar8;
      local_170 = pfVar37;
      if (uVar20 != uVar26) {
LAB_0027a7f7:
        local_168 = local_2e0;
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      local_2d8.m_dst = &local_240;
      local_2d8.m_src = (SrcEvaluatorType *)local_208;
      local_2d8.m_functor = &local_2e9;
      local_2d8.m_dstExpr = (DstXprType *)&local_258;
      local_240.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
      .m_data = local_258;
      local_240.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value = (long)local_250;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_-1,_1,_0,_-1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_-1,_1,_0,_-1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>,_3,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
             *)&local_2d8);
      Parameters::clear(this_00);
      auVar80 = ZEXT1664(local_298);
      auVar43 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar44 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar45 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      plVar22 = (long *)(ulong)((int)local_270 + 1);
      eVar32 = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                )((long)local_268 + 8);
      pDVar18 = local_2d8.m_dst;
      paVar19 = local_2d8.m_functor;
    } while (eVar32 != local_278);
    pMVar21 = (local_2e8->super_Trainer).model;
  }
  plVar22 = *(long **)(pMVar21 + 0x30);
  local_210 = *(long **)(pMVar21 + 0x38);
  pAVar27 = local_2e8;
  if (plVar22 != local_210) {
    local_280._0_4_ = local_280._0_4_ * (float)local_2b8;
    auVar42 = vbroadcasti64x4_avx512f(_DAT_002e5dc0);
    auVar45 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar44 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar43 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    local_2b8 = 0;
    local_78 = vmovdqu64_avx512f(auVar42);
    local_228 = ZEXT416((uint)local_280._0_4_);
    local_2b0 = CONCAT44(local_2b0._4_4_,local_280._0_4_ * local_280._0_4_);
    do {
      plVar36 = *(long **)(*plVar22 + 0x70);
      local_298._0_8_ = *plVar22;
      local_280 = plVar22;
      if (plVar36 != (long *)0x0) {
        local_278 = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                     )((pAVar27->hlg).
                       super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_2b8);
        local_2a8 = (pAVar27->hld).
                    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                    ._M_impl.super__Vector_impl_data._M_start + local_2b8;
        pDVar18 = local_2d8.m_dst;
        paVar19 = local_2d8.m_functor;
        do {
          local_2d8.m_functor._4_4_ = (undefined4)((ulong)paVar19 >> 0x20);
          local_2d8.m_dst._4_4_ = (undefined4)((ulong)pDVar18 >> 0x20);
          uVar28 = (ulong)*(uint *)(plVar36 + 1);
          iVar77 = 1;
          iVar78 = 1;
          lVar23 = *(long *)(local_298._0_8_ + 0x48);
          lVar25 = uVar28 * 0x48;
          uVar24 = (ulong)*(uint *)(lVar23 + 0x1c + lVar25);
          if (uVar24 != 0) {
            auVar42 = vmovdqa64_avx512f(auVar45);
            auVar80 = vpbroadcastq_avx512f();
            uVar29 = 0;
            do {
              auVar46 = vpbroadcastq_avx512f();
              auVar47 = vmovdqa64_avx512f(auVar42);
              auVar42 = vporq_avx512f(auVar46,auVar44);
              auVar46 = vporq_avx512f(auVar46,auVar43);
              uVar14 = vpcmpuq_avx512f(auVar46,auVar80,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar42,auVar80,2);
              bVar16 = (byte)uVar14;
              uVar39 = CONCAT11(bVar16,bVar15);
              auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar23 + lVar25 + uVar29 * 4));
              auVar59._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
              auVar59._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
              auVar59._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
              auVar59._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
              auVar59._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
              auVar59._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
              auVar59._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
              auVar59._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
              auVar59._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
              auVar59._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
              auVar59._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
              auVar59._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
              auVar59._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
              auVar59._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
              auVar59._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
              auVar59._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
              uVar29 = uVar29 + 0x10;
              auVar42 = vpmulld_avx512f(auVar59,auVar47);
            } while ((uVar24 + 0xf & 0x1fffffff0) != uVar29);
            auVar42 = vmovdqa32_avx512f(auVar42);
            auVar60._0_4_ =
                 (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar47._0_4_;
            bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar60._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar47._4_4_;
            bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar60._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar47._8_4_;
            bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar60._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar47._12_4_;
            bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar60._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar47._16_4_;
            bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar60._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar47._20_4_;
            bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar60._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar47._24_4_;
            bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar60._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar47._28_4_;
            auVar60._32_4_ =
                 (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar47._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar60._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar47._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar60._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar47._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar60._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar47._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar60._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar47._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar60._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar47._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar60._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar47._56_4_;
            auVar60._60_4_ =
                 (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar47._60_4_;
            auVar41 = vextracti64x4_avx512f(auVar60,1);
            auVar42 = vpmulld_avx512f(auVar60,ZEXT3264(auVar41));
            auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar40 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            auVar40 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            iVar78 = auVar12._0_4_;
          }
          eVar32 = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                    )(uVar28 * 9);
          lVar30 = *(long *)(local_298._0_8_ + 0x30) + uVar28 * 0x48;
          if ((ulong)*(uint *)(lVar30 + 0x1c) != 0) {
            auVar42 = vmovdqa64_avx512f(auVar45);
            auVar80 = vpbroadcastq_avx512f();
            uVar24 = 0;
            do {
              auVar46 = vpbroadcastq_avx512f();
              auVar47 = vmovdqa64_avx512f(auVar42);
              auVar42 = vporq_avx512f(auVar46,auVar44);
              auVar46 = vporq_avx512f(auVar46,auVar43);
              uVar14 = vpcmpuq_avx512f(auVar46,auVar80,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar42,auVar80,2);
              bVar16 = (byte)uVar14;
              uVar39 = CONCAT11(bVar16,bVar15);
              auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar30 + uVar24 * 4));
              auVar61._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
              auVar61._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
              auVar61._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
              auVar61._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
              auVar61._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
              auVar61._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
              auVar61._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
              auVar61._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
              auVar61._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
              auVar61._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
              auVar61._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
              auVar61._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
              auVar61._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
              auVar61._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
              auVar61._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
              auVar61._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
              uVar24 = uVar24 + 0x10;
              auVar42 = vpmulld_avx512f(auVar61,auVar47);
            } while (((ulong)*(uint *)(lVar30 + 0x1c) + 0xf & 0x1fffffff0) != uVar24);
            auVar42 = vmovdqa32_avx512f(auVar42);
            auVar62._0_4_ =
                 (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar47._0_4_;
            bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar62._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar47._4_4_;
            bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar62._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar47._8_4_;
            bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar62._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar47._12_4_;
            bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar62._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar47._16_4_;
            bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar62._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar47._20_4_;
            bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar62._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar47._24_4_;
            bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar62._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar47._28_4_;
            auVar62._32_4_ =
                 (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar47._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar62._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar47._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar62._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar47._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar62._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar47._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar62._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar47._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar62._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar47._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar62._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar47._56_4_;
            auVar62._60_4_ =
                 (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar47._60_4_;
            auVar41 = vextracti64x4_avx512f(auVar62,1);
            auVar42 = vpmulld_avx512f(auVar62,ZEXT3264(auVar41));
            auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar40 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            auVar40 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            iVar77 = auVar12._0_4_;
          }
          rVar1 = (pAVar27->super_Trainer).lambda;
          uVar26 = iVar78 * *(int *)(lVar23 + lVar25 + 0x20);
          uVar29 = (ulong)uVar26;
          pPVar33 = (Parameters *)(ulong)(uint)(iVar77 * *(int *)(lVar30 + 0x20));
          pfVar5 = *(float **)(lVar23 + 0x28 + lVar25);
          eVar9 = *(evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                    *)(*(long *)(local_298._0_8_ + 0x30) + 0x28 + uVar28 * 0x48);
          lVar23 = *(long *)local_278 + lVar25;
          uVar24 = (ulong)*(uint *)(lVar23 + 0x1c);
          lVar25 = *(long *)&(local_2a8->h).
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl +
                   lVar25;
          uVar28 = *(ulong *)(lVar23 + 0x28);
          if (uVar24 == 0) {
            uVar20 = *(uint *)(lVar23 + 0x20);
            if (uVar20 != uVar26) goto LAB_0027a847;
            rVar79 = pAVar27->rho;
LAB_00279f90:
            iVar77 = 1;
          }
          else {
            auVar42 = vmovdqa64_avx512f(auVar45);
            uVar35 = uVar24 + 0xf & 0x1fffffff0;
            auVar80 = vpbroadcastq_avx512f();
            uVar34 = 0;
            do {
              auVar46 = vpbroadcastq_avx512f();
              auVar47 = vmovdqa64_avx512f(auVar42);
              auVar42 = vporq_avx512f(auVar46,auVar44);
              auVar46 = vporq_avx512f(auVar46,auVar43);
              uVar14 = vpcmpuq_avx512f(auVar46,auVar80,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar42,auVar80,2);
              bVar16 = (byte)uVar14;
              uVar39 = CONCAT11(bVar16,bVar15);
              auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar23 + uVar34 * 4));
              auVar63._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
              auVar63._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
              auVar63._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
              auVar63._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
              auVar63._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
              auVar63._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
              auVar63._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
              auVar63._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
              auVar63._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
              auVar63._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
              auVar63._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
              auVar63._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
              auVar63._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
              auVar63._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
              auVar63._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
              auVar63._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
              uVar34 = uVar34 + 0x10;
              auVar42 = vpmulld_avx512f(auVar63,auVar47);
            } while (uVar35 != uVar34);
            auVar42 = vmovdqa32_avx512f(auVar42);
            auVar64._0_4_ =
                 (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar47._0_4_;
            bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar64._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar47._4_4_;
            bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar64._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar47._8_4_;
            bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar64._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar47._12_4_;
            bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar64._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar47._16_4_;
            bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar64._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar47._20_4_;
            bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar64._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar47._24_4_;
            bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar64._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar47._28_4_;
            auVar64._32_4_ =
                 (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar47._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar64._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar47._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar64._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar47._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar64._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar47._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar64._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar47._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar64._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar47._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar64._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar47._56_4_;
            auVar64._60_4_ =
                 (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar47._60_4_;
            auVar41 = vextracti64x4_avx512f(auVar64,1);
            uVar20 = *(uint *)(lVar23 + 0x20);
            auVar42 = vpmulld_avx512f(auVar64,ZEXT3264(auVar41));
            auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar40 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            auVar40 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            if (auVar12._0_4_ * uVar20 != uVar26) goto LAB_0027a847;
            rVar79 = pAVar27->rho;
            if (uVar24 == 0) goto LAB_00279f90;
            uVar24 = 0;
            auVar42 = vmovdqa64_avx512f(auVar45);
            do {
              auVar46 = vpbroadcastq_avx512f();
              auVar47 = vmovdqa64_avx512f(auVar42);
              auVar42 = vporq_avx512f(auVar46,auVar44);
              auVar46 = vporq_avx512f(auVar46,auVar43);
              uVar14 = vpcmpuq_avx512f(auVar46,auVar80,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar42,auVar80,2);
              bVar16 = (byte)uVar14;
              uVar39 = CONCAT11(bVar16,bVar15);
              auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar23 + uVar24 * 4));
              auVar65._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
              auVar65._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
              auVar65._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
              auVar65._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
              auVar65._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
              auVar65._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
              auVar65._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
              auVar65._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
              auVar65._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
              auVar65._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
              auVar65._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
              auVar65._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
              auVar65._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
              auVar65._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
              auVar65._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
              auVar65._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
              uVar24 = uVar24 + 0x10;
              auVar42 = vpmulld_avx512f(auVar65,auVar47);
            } while (uVar35 != uVar24);
            auVar42 = vmovdqa32_avx512f(auVar42);
            auVar66._0_4_ =
                 (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar47._0_4_;
            bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar66._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar47._4_4_;
            bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar66._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar47._8_4_;
            bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar66._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar47._12_4_;
            bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar66._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar47._16_4_;
            bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar66._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar47._20_4_;
            bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar66._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar47._24_4_;
            bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar66._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar47._28_4_;
            auVar66._32_4_ =
                 (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar47._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar66._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar47._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar66._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar47._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar66._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar47._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar66._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar47._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar66._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar47._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar66._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar47._56_4_;
            auVar66._60_4_ =
                 (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar47._60_4_;
            auVar41 = vextracti64x4_avx512f(auVar66,1);
            auVar42 = vpmulld_avx512f(auVar66,ZEXT3264(auVar41));
            auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar40 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            auVar40 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            iVar77 = auVar12._0_4_;
          }
          local_208._0_4_ = rVar79;
          local_2d8.m_dst._0_4_ = (float)local_228._0_4_;
          local_208._12_4_ = (undefined4)uVar28;
          local_208._16_4_ = (undefined4)(uVar28 >> 0x20);
          local_2d8.m_src._4_4_ = SUB84(pfVar5,0);
          local_2d8.m_functor._0_4_ = (undefined4)((ulong)pfVar5 >> 0x20);
          if (uVar20 * iVar77 != uVar26) goto LAB_0027a7d5;
          uVar24 = uVar29;
          if (((uVar28 & 3) == 0) &&
             (uVar24 = (ulong)(-((uint)(uVar28 >> 2) & 0x3fffffff) & 0xf), uVar29 <= uVar24)) {
            uVar24 = uVar29;
          }
          auVar42 = vmovdqu64_avx512f(local_78);
          uVar35 = uVar29 - uVar24;
          uVar34 = uVar35 + 0xf;
          if (-1 < (long)uVar35) {
            uVar34 = uVar35;
          }
          fVar11 = 1.0 - rVar79;
          auVar42 = vpermt2d_avx512f(ZEXT3264(CONCAT1616(CONCAT412(local_228._0_4_,
                                                                   CONCAT48(local_228._0_4_,
                                                                            CONCAT44(local_228._0_4_
                                                                                     ,local_228.
                                                                                      _0_4_))),
                                                         ZEXT416((uint)fVar11))),auVar42,
                                     ZEXT864(pfVar5));
          auVar80 = valignd_avx512f(auVar42,auVar42,9);
          if (uVar24 != 0) {
            lVar30 = 0;
            do {
              auVar12 = vfmadd132ss_fma(ZEXT416((uint)(fVar11 * (float)local_2b0 *
                                                      *(float *)(auVar80._0_8_ + lVar30 * 4))),
                                        ZEXT416((uint)(rVar79 * *(float *)(uVar28 + lVar30 * 4))),
                                        ZEXT416((uint)pfVar5[lVar30]));
              *(int *)(uVar28 + lVar30 * 4) = auVar12._0_4_;
              lVar30 = lVar30 + 1;
            } while (uVar24 != lVar30);
          }
          lVar30 = uVar24 + (uVar34 & 0xfffffffffffffff0);
          if (0xf < (long)uVar35) {
            auVar46 = vpmovsxbd_avx512f(_DAT_002e5da0);
            auVar42 = vpermt2d_avx512f(auVar42,auVar46,ZEXT464(uVar26));
            auVar46 = vbroadcastss_avx512f(ZEXT416((uint)rVar79));
            auVar40 = vextracti32x4_avx512f(auVar42,2);
            lVar31 = vpextrq_avx(auVar40,1);
            auVar12 = vpshufd_avx(auVar42._16_16_,0xee);
            auVar42 = vbroadcastss_avx512f
                                (ZEXT416((uint)(auVar12._0_4_ * auVar42._0_4_ *
                                               (float)local_228._0_4_)));
            do {
              auVar47 = vmulps_avx512f(auVar46,*(undefined1 (*) [64])(uVar28 + uVar24 * 4));
              auVar48 = vmulps_avx512f(auVar42,*(undefined1 (*) [64])
                                                ((lVar31 << 0x20 | auVar40._0_8_ >> 0x20) +
                                                uVar24 * 4));
              auVar47 = vfmadd132ps_avx512f(auVar48,auVar47,*(undefined1 (*) [64])(pfVar5 + uVar24))
              ;
              *(undefined1 (*) [64])(uVar28 + uVar24 * 4) = auVar47;
              uVar24 = uVar24 + 0x10;
            } while ((long)uVar24 < lVar30);
          }
          if (lVar30 < (long)uVar29) {
            do {
              auVar12 = vfmadd132ss_fma(ZEXT416((uint)(fVar11 * (float)local_2b0 *
                                                      *(float *)(auVar80._0_8_ + lVar30 * 4))),
                                        ZEXT416((uint)(rVar79 * *(float *)(uVar28 + lVar30 * 4))),
                                        ZEXT416((uint)pfVar5[lVar30]));
              *(int *)(uVar28 + lVar30 * 4) = auVar12._0_4_;
              lVar30 = lVar30 + 1;
            } while (uVar29 != lVar30);
          }
          pfVar7 = *(float **)(lVar25 + 0x28);
          uVar28 = (ulong)*(uint *)(lVar25 + 0x1c);
          if (uVar28 == 0) {
            iVar77 = 1;
          }
          else {
            auVar42 = vmovdqa64_avx512f(auVar45);
            auVar80 = vpbroadcastq_avx512f();
            uVar24 = 0;
            do {
              auVar46 = vpbroadcastq_avx512f();
              auVar47 = vmovdqa64_avx512f(auVar42);
              auVar42 = vporq_avx512f(auVar46,auVar44);
              auVar46 = vporq_avx512f(auVar46,auVar43);
              uVar14 = vpcmpuq_avx512f(auVar46,auVar80,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar42,auVar80,2);
              bVar16 = (byte)uVar14;
              uVar39 = CONCAT11(bVar16,bVar15);
              auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar25 + uVar24 * 4));
              auVar67._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
              auVar67._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
              auVar67._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
              auVar67._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
              auVar67._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
              auVar67._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
              auVar67._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
              auVar67._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
              auVar67._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
              auVar67._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
              auVar67._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
              auVar67._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
              auVar67._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
              auVar67._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
              auVar67._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
              auVar67._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
              uVar24 = uVar24 + 0x10;
              auVar42 = vpmulld_avx512f(auVar67,auVar47);
            } while ((uVar28 + 0xf & 0x1fffffff0) != uVar24);
            auVar42 = vmovdqa32_avx512f(auVar42);
            auVar68._0_4_ =
                 (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar47._0_4_;
            bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar68._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar47._4_4_;
            bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar68._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar47._8_4_;
            bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar68._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar47._12_4_;
            bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar68._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar47._16_4_;
            bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar68._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar47._20_4_;
            bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar68._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar47._24_4_;
            bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar68._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar47._28_4_;
            auVar68._32_4_ =
                 (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar47._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar68._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar47._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar68._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar47._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar68._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar47._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar68._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar47._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar68._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar47._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar68._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar47._56_4_;
            auVar68._60_4_ =
                 (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar47._60_4_;
            auVar41 = vextracti64x4_avx512f(auVar68,1);
            auVar42 = vpmulld_avx512f(auVar68,ZEXT3264(auVar41));
            auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar40 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            auVar40 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            iVar77 = auVar12._0_4_;
          }
          uVar20 = *(uint *)(lVar25 + 0x20);
          uVar24 = (ulong)(iVar77 * uVar20);
          local_2a0 = eVar32;
          local_268 = eVar9;
          local_260 = pPVar33;
          if (uVar26 - iVar77 * uVar20 != 0) goto LAB_0027a819;
          if ((ulong)*(uint *)(lVar23 + 0x1c) == 0) {
            iVar77 = 1;
          }
          else {
            auVar42 = vmovdqa64_avx512f(auVar45);
            auVar80 = vpbroadcastq_avx512f();
            uVar34 = 0;
            do {
              auVar46 = vpbroadcastq_avx512f();
              auVar47 = vmovdqa64_avx512f(auVar42);
              auVar42 = vporq_avx512f(auVar46,auVar44);
              auVar46 = vporq_avx512f(auVar46,auVar43);
              uVar14 = vpcmpuq_avx512f(auVar46,auVar80,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar42,auVar80,2);
              bVar16 = (byte)uVar14;
              uVar39 = CONCAT11(bVar16,bVar15);
              auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar23 + uVar34 * 4));
              auVar69._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
              auVar69._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
              auVar69._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
              auVar69._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
              auVar69._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
              auVar69._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
              auVar69._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
              auVar69._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
              auVar69._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
              auVar69._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
              auVar69._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
              auVar69._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
              auVar69._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
              auVar69._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
              auVar69._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
              auVar69._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
              uVar34 = uVar34 + 0x10;
              auVar42 = vpmulld_avx512f(auVar69,auVar47);
            } while (((ulong)*(uint *)(lVar23 + 0x1c) + 0xf & 0x1fffffff0) != uVar34);
            auVar42 = vmovdqa32_avx512f(auVar42);
            auVar70._0_4_ =
                 (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar47._0_4_;
            bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar70._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar47._4_4_;
            bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar70._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar47._8_4_;
            bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar70._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar47._12_4_;
            bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar70._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar47._16_4_;
            bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar70._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar47._20_4_;
            bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar70._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar47._24_4_;
            bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar70._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar47._28_4_;
            auVar70._32_4_ =
                 (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar47._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar70._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar47._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar70._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar47._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar70._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar47._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar70._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar47._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar70._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar47._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar70._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar47._56_4_;
            auVar70._60_4_ =
                 (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar47._60_4_;
            auVar41 = vextracti64x4_avx512f(auVar70,1);
            auVar42 = vpmulld_avx512f(auVar70,ZEXT3264(auVar41));
            auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar40 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            auVar40 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            iVar77 = auVar12._0_4_;
          }
          uVar38 = iVar77 * *(int *)(lVar23 + 0x20);
          pfVar37 = (float *)(ulong)uVar38;
          local_270 = plVar36;
          if (uVar26 - uVar38 != 0) goto LAB_0027a875;
          sVar2.m_other = pAVar27->epsilon;
          pfVar8 = *(float **)(lVar23 + 0x28);
          if (uVar28 == 0) {
            if (uVar20 != uVar26) goto LAB_0027a830;
            local_208._12_4_ = local_2e8->rho;
            uVar38 = uVar20;
LAB_0027a3fb:
            iVar77 = 1;
          }
          else {
            auVar42 = vmovdqa64_avx512f(auVar45);
            uVar34 = uVar28 + 0xf & 0x1fffffff0;
            auVar80 = vpbroadcastq_avx512f();
            uVar35 = 0;
            do {
              auVar46 = vpbroadcastq_avx512f();
              auVar47 = vmovdqa64_avx512f(auVar42);
              auVar42 = vporq_avx512f(auVar46,auVar44);
              auVar46 = vporq_avx512f(auVar46,auVar43);
              uVar14 = vpcmpuq_avx512f(auVar46,auVar80,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar42,auVar80,2);
              bVar16 = (byte)uVar14;
              uVar39 = CONCAT11(bVar16,bVar15);
              auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar25 + uVar35 * 4));
              auVar71._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
              auVar71._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
              auVar71._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
              auVar71._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
              auVar71._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
              auVar71._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
              auVar71._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
              auVar71._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
              auVar71._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
              auVar71._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
              auVar71._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
              auVar71._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
              auVar71._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
              auVar71._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
              auVar71._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
              auVar71._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
              uVar35 = uVar35 + 0x10;
              auVar42 = vpmulld_avx512f(auVar71,auVar47);
            } while (uVar34 != uVar35);
            auVar42 = vmovdqa32_avx512f(auVar42);
            auVar72._0_4_ =
                 (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar47._0_4_;
            bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar72._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar47._4_4_;
            bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar72._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar47._8_4_;
            bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar72._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar47._12_4_;
            bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar72._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar47._16_4_;
            bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar72._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar47._20_4_;
            bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar72._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar47._24_4_;
            bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar72._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar47._28_4_;
            auVar72._32_4_ =
                 (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar47._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar72._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar47._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar72._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar47._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar72._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar47._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar72._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar47._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar72._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar47._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar72._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar47._56_4_;
            auVar72._60_4_ =
                 (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar47._60_4_;
            auVar41 = vextracti64x4_avx512f(auVar72,1);
            auVar42 = vpmulld_avx512f(auVar72,ZEXT3264(auVar41));
            auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar40 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            auVar40 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            uVar38 = auVar12._0_4_ * uVar20;
            if (uVar38 != uVar26) goto LAB_0027a830;
            local_208._12_4_ = local_2e8->rho;
            if (uVar28 == 0) goto LAB_0027a3fb;
            uVar28 = 0;
            auVar42 = vmovdqa64_avx512f(auVar45);
            do {
              auVar45 = vpbroadcastq_avx512f();
              auVar46 = vmovdqa64_avx512f(auVar42);
              auVar42 = vporq_avx512f(auVar45,auVar44);
              auVar45 = vporq_avx512f(auVar45,auVar43);
              uVar14 = vpcmpuq_avx512f(auVar45,auVar80,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar42,auVar80,2);
              bVar16 = (byte)uVar14;
              uVar39 = CONCAT11(bVar16,bVar15);
              auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar25 + uVar28 * 4));
              auVar73._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
              auVar73._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
              auVar73._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
              auVar73._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
              auVar73._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
              auVar73._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
              auVar73._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
              auVar73._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
              auVar73._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
              auVar73._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
              auVar73._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
              auVar73._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
              auVar73._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
              auVar73._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
              auVar73._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
              auVar73._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
              uVar28 = uVar28 + 0x10;
              auVar42 = vpmulld_avx512f(auVar73,auVar46);
            } while (uVar34 != uVar28);
            auVar42 = vmovdqa32_avx512f(auVar42);
            auVar74._0_4_ =
                 (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar46._0_4_;
            bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar74._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar46._4_4_;
            bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar74._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar46._8_4_;
            bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar74._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar46._12_4_;
            bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar74._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar46._16_4_;
            bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar74._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar46._20_4_;
            bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar74._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar46._24_4_;
            bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar74._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar46._28_4_;
            auVar74._32_4_ =
                 (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar46._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar74._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar46._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar74._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar46._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar74._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar46._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar74._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar46._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar74._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar46._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar74._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar46._56_4_;
            auVar74._60_4_ =
                 (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar46._60_4_;
            auVar41 = vextracti64x4_avx512f(auVar74,1);
            auVar42 = vpmulld_avx512f(auVar74,ZEXT3264(auVar41));
            auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar40 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            auVar40 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            iVar77 = auVar12._0_4_;
          }
          local_250 = (float *)(ulong)(uVar20 * iVar77);
          local_208._40_8_ = ZEXT48(uVar38);
          stack0xfffffffffffffe28 =
               (float *)CONCAT44(1.0 - (float)local_208._12_4_,local_208._48_4_);
          local_1a4.m_other = (float)local_228._0_4_;
          local_158.m_functor.m_other = sVar2.m_other;
          local_104.m_other = (float)local_228._0_4_;
          local_258 = pfVar7;
          local_208._24_8_ = pfVar7;
          local_198 = pfVar5;
          local_188.m_value = uVar29;
          local_170 = pfVar7;
          local_160.m_value = uVar24;
          local_140 = pfVar8;
          local_130.m_value = (long)pfVar37;
          local_128.m_other = sVar2.m_other;
          local_f8 = pfVar5;
          local_e8.m_value = uVar29;
          local_d0 = pfVar7;
          local_c0.m_value = uVar24;
          local_b8.m_other = sVar2.m_other;
          local_a0 = pfVar8;
          local_90.m_value = (long)pfVar37;
          local_88.m_other = sVar2.m_other;
          if (uVar20 * iVar77 != uVar26) goto LAB_0027a7d5;
          local_2d8.m_dst = &local_240;
          local_2d8.m_src = (SrcEvaluatorType *)local_208;
          local_2d8.m_functor = &local_2e9;
          local_2d8.m_dstExpr = (DstXprType *)&local_258;
          local_2e0 = sVar2.m_other;
          local_2dc = rVar1;
          local_240.
          super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
          .m_data = pfVar7;
          local_240.
          super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
          .m_outerStride.m_value = (long)pfVar37;
          Eigen::internal::dense_assignment_loop<$6ae401cf$>::run(&local_2d8);
          if (uVar26 != (uint)local_260) goto LAB_0027a85e;
          lVar23 = *(long *)(local_298._0_8_ + 0x30) + (long)local_2a0 * 8;
          if ((ulong)*(uint *)(lVar23 + 0x1c) == 0) {
            iVar77 = 1;
          }
          else {
            auVar42 = vpbroadcastd_avx512f(ZEXT416(1));
            auVar43 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar45 = vpbroadcastq_avx512f();
            uVar28 = 0;
            do {
              auVar80 = vpbroadcastq_avx512f();
              auVar46 = vmovdqa64_avx512f(auVar42);
              auVar42 = vporq_avx512f(auVar80,auVar43);
              auVar80 = vporq_avx512f(auVar80,auVar44);
              uVar14 = vpcmpuq_avx512f(auVar80,auVar45,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar42,auVar45,2);
              bVar16 = (byte)uVar14;
              uVar39 = CONCAT11(bVar16,bVar15);
              auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar23 + uVar28 * 4));
              auVar75._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar42._4_4_;
              auVar75._0_4_ = (uint)(bVar15 & 1) * auVar42._0_4_;
              auVar75._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar42._8_4_;
              auVar75._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar42._12_4_;
              auVar75._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar42._16_4_;
              auVar75._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar42._20_4_;
              auVar75._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar42._24_4_;
              auVar75._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar42._28_4_;
              auVar75._32_4_ = (uint)(bVar16 & 1) * auVar42._32_4_;
              auVar75._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar42._36_4_;
              auVar75._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar42._40_4_;
              auVar75._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar42._44_4_;
              auVar75._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar42._48_4_;
              auVar75._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar42._52_4_;
              auVar75._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar42._56_4_;
              auVar75._60_4_ = (uint)(bVar16 >> 7) * auVar42._60_4_;
              uVar28 = uVar28 + 0x10;
              auVar42 = vpmulld_avx512f(auVar75,auVar46);
            } while (((ulong)*(uint *)(lVar23 + 0x1c) + 0xf & 0x1fffffff0) != uVar28);
            auVar42 = vmovdqa32_avx512f(auVar42);
            auVar76._0_4_ =
                 (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar46._0_4_;
            bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar76._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * auVar46._4_4_;
            bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar76._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar46._8_4_;
            bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar76._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * auVar46._12_4_;
            bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar76._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * auVar46._16_4_;
            bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar76._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * auVar46._20_4_;
            bVar10 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar76._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * auVar46._24_4_;
            bVar10 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar76._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * auVar46._28_4_;
            auVar76._32_4_ =
                 (uint)(bVar16 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar46._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar76._36_4_ = (uint)bVar10 * auVar42._36_4_ | (uint)!bVar10 * auVar46._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar76._40_4_ = (uint)bVar10 * auVar42._40_4_ | (uint)!bVar10 * auVar46._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar76._44_4_ = (uint)bVar10 * auVar42._44_4_ | (uint)!bVar10 * auVar46._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar76._48_4_ = (uint)bVar10 * auVar42._48_4_ | (uint)!bVar10 * auVar46._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar76._52_4_ = (uint)bVar10 * auVar42._52_4_ | (uint)!bVar10 * auVar46._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar76._56_4_ = (uint)bVar10 * auVar42._56_4_ | (uint)!bVar10 * auVar46._56_4_;
            auVar76._60_4_ =
                 (uint)(bVar16 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar46._60_4_;
            auVar41 = vextracti64x4_avx512f(auVar76,1);
            auVar42 = vpmulld_avx512f(auVar76,ZEXT3264(auVar41));
            auVar12 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar40 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            auVar40 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar40);
            iVar77 = auVar12._0_4_;
          }
          uVar20 = iVar77 * *(int *)(lVar23 + 0x20);
          local_250 = (float *)(ulong)uVar20;
          local_258 = *(float **)(*(long *)(local_298._0_8_ + 0x30) + 0x28 + (long)local_2a0 * 8);
          local_208._36_4_ = local_228._0_4_;
          local_198 = (float *)CONCAT44(local_198._4_4_,local_2e0);
          local_168 = local_2e0;
          local_158 = local_268;
          local_148 = local_260;
          local_140 = (float *)CONCAT44(local_140._4_4_,local_2dc);
          unique0x10002a13 = pfVar5;
          local_1c8 = uVar29;
          local_1b0 = pfVar7;
          local_1a0 = uVar24;
          local_180 = pfVar8;
          local_170 = pfVar37;
          if (uVar20 != uVar26) goto LAB_0027a7f7;
          local_2d8.m_dst = &local_240;
          local_2d8.m_src = (SrcEvaluatorType *)local_208;
          local_2d8.m_functor = &local_2e9;
          local_2d8.m_dstExpr = (DstXprType *)&local_258;
          local_240.
          super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
          .m_data = local_258;
          local_240.
          super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
          .m_outerStride.m_value = (long)local_250;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_-1,_1,_0,_-1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_-1,_1,_0,_-1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>,_3,_0>
          ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
                 *)&local_2d8);
          auVar43 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar44 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar45 = vpbroadcastd_avx512f(ZEXT416(1));
          plVar36 = (long *)*local_270;
          pAVar27 = local_2e8;
          pDVar18 = local_2d8.m_dst;
          paVar19 = local_2d8.m_functor;
        } while (plVar36 != (long *)0x0);
      }
      LookupParameters::clear((LookupParameters *)local_298._0_8_);
      auVar43 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar44 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar45 = vpbroadcastd_avx512f(ZEXT416(1));
      local_2b8 = (ulong)((int)local_2b8 + 1);
      plVar22 = local_280 + 1;
    } while (plVar22 != local_210);
  }
  (pAVar27->super_Trainer).updates = (pAVar27->super_Trainer).updates + 1.0;
  return;
LAB_0027a847:
  local_2d8.m_functor = paVar19;
  local_2d8.m_dst = pDVar18;
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>]"
  ;
  goto LAB_0027a88a;
LAB_0027a819:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>]"
  ;
  goto LAB_0027a88a;
LAB_0027a875:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<float>, Lhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::Cwi..." /* TRUNCATED STRING LITERAL */
  ;
  goto LAB_0027a88a;
LAB_0027a830:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen..." /* TRUNCATED STRING LITERAL */
  ;
  goto LAB_0027a88a;
LAB_0027a85e:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::Ma..." /* TRUNCATED STRING LITERAL */
  ;
LAB_0027a88a:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
}

Assistant:

void AdadeltaTrainer::update(real scale) {
  unsigned pi;
  if (!shadow_params_allocated) {
    hg = AllocateShadowParameters(*model);
    hlg = AllocateShadowLookupParameters(*model);
    hd = AllocateShadowParameters(*model);
    hld = AllocateShadowLookupParameters(*model);

    /*pi = 0;
    for (auto p : model->parameters_list()) {
      TensorTools::Constant(hg[pi].h, epsilon);
      TensorTools::Constant(hd[pi].h, epsilon);
      ++pi;
    }

    pi = 0;
    for (auto p : model->lookup_parameters_list()) {
      vector<Tensor>& hgx = hlg[pi].h;
      vector<Tensor>& hdx = hld[pi].h;
      for (unsigned i = 0; i < hgx.size(); ++i) {
        TensorTools::Constant(hgx[i], epsilon);
        TensorTools::Constant(hdx[i], epsilon);
      }
      ++pi;
    }*/

    shadow_params_allocated = true;
  }

  const float gscale = clip_gradients();
  pi = 0;
  for (auto p : model->parameters_list()) {
    auto& g = (scale * gscale) * p->g.vec();
    Tensor& hgv = hg[pi].h;
    Tensor& hdv = hd[pi].h;
    auto reg = p->values.vec() * lambda;
    auto g2 = g.cwiseProduct(g);
    hgv.vec() = rho * hgv.vec() + (1.0 - rho) * g2;
    auto num = -g.cwiseProduct((hdv.vec().array() + epsilon).matrix().cwiseSqrt());
    auto den = (hgv.vec().array() + epsilon).matrix().cwiseSqrt();
    auto delta = num.cwiseQuotient(den);
    auto d2 = delta.cwiseProduct(delta);
    hdv.vec() = rho * hdv.vec() + (1.0 - rho) * d2;
    p->values.vec() += delta - reg;
    p->clear();
    pi++;
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<Tensor>& hgvx = hlg[pi].h;
    vector<Tensor>& hdvx = hld[pi].h;
    for (auto i : p->non_zero_grads) {
      Tensor& hgv = hgvx[i];
      Tensor& hdv = hdvx[i];
      auto& g = scale * gscale * p->grads[i].vec();
      auto reg = p->values[i].vec() * lambda;
      auto g2 = g.cwiseProduct(g);
      hgv.vec() = rho * hgv.vec() + (1.0 - rho) * g2;
      auto num = -g.cwiseProduct((hdv.vec().array() + epsilon).matrix().cwiseSqrt());
      auto den = (hgv.vec().array() + epsilon).matrix().cwiseSqrt();
      auto delta = num.cwiseQuotient(den);
      auto d2 = delta.cwiseProduct(delta);
      hdv.vec() = rho * hdv.vec() + (1.0 - rho) * d2;
      p->values[i].vec() += delta - reg;
    }
    p->clear();
    pi++;
  }
  ++updates;
}